

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

void __thiscall kj::MainBuilder::MainImpl::printHelp(MainImpl *this,StringPtr programName)

{
  StringPtr *pSVar1;
  ChunkHeader *pCVar2;
  Arg *pAVar3;
  byte *__src;
  byte *pbVar4;
  void *pvVar5;
  ArrayPtr<const_char> text_00;
  ProcessContext *pPVar6;
  undefined8 uVar7;
  char *pcVar8;
  _Rb_tree_node_base *p_Var9;
  undefined1 *puVar10;
  byte *pbVar11;
  _Rb_tree_node_base *p_Var12;
  Impl *params_1;
  Impl *pIVar13;
  Arg *arg;
  Arg *this_00;
  ObjectHeader *pOVar14;
  byte **params;
  size_t sVar15;
  undefined1 *puVar16;
  _Base_ptr p_Var17;
  byte *newSize;
  undefined1 *puVar18;
  MainImpl *pMVar19;
  Impl *pIVar20;
  char **params_2;
  char **ppcVar21;
  ChunkHeader *params_2_00;
  ProcessContext *pPVar22;
  Impl *pIVar23;
  size_t sVar24;
  _Rb_tree_header *p_Var25;
  long lVar26;
  StringPtr indent;
  StringPtr indent_00;
  StringPtr indent_01;
  Vector<char> text;
  set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
  sortedOptions;
  undefined1 local_108 [32];
  undefined1 local_e8 [64];
  StringPtr local_a8;
  Array<char> local_98;
  Impl *local_80;
  _Base_ptr local_78;
  char local_70 [8];
  _Base_ptr local_68;
  _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
  local_60 [8];
  _Rb_tree_color local_58;
  _Base_ptr local_50;
  Impl *local_48;
  Impl *local_40;
  _Base_ptr local_38;
  
  local_68 = (_Base_ptr)programName.content.size_;
  local_70 = (char  [8])programName.content.ptr;
  pMVar19 = (MainImpl *)local_108;
  params_2 = (char **)0x0;
  local_108._0_8_ =
       kj::_::HeapArrayDisposer::allocateImpl
                 (1,0,0x400,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_108._16_8_ =
       &(((Impl *)(local_108._0_8_ + 0x360))->longOptions)._M_t._M_impl.super__Rb_tree_header.
        _M_header._M_left;
  local_108._24_8_ = &kj::_::HeapArrayDisposer::instance;
  local_48 = (Impl *)&stack0xffffffffffffffa8;
  local_58 = _S_red;
  local_50 = (_Base_ptr)0x0;
  local_38 = (_Base_ptr)0x0;
  pIVar20 = (this->impl).ptr;
  p_Var9 = (pIVar20->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var25 = &(pIVar20->shortOptions)._M_t._M_impl.super__Rb_tree_header;
  local_108._8_8_ = local_108._0_8_;
  local_e8._40_8_ = this;
  local_40 = local_48;
  if ((_Rb_tree_header *)p_Var9 != p_Var25) {
    do {
      std::
      _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
      ::_M_insert_unique<kj::MainBuilder::Impl::Option_const*const&>
                (local_60,(Option **)&p_Var9[1]._M_parent);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var25);
  }
  p_Var9 = ((*(Impl **)(local_e8._40_8_ + 8))->longOptions)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  p_Var25 = &((*(Impl **)(local_e8._40_8_ + 8))->longOptions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var25) {
    do {
      std::
      _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
      ::_M_insert_unique<kj::MainBuilder::Impl::Option_const*const&>
                (local_60,(Option **)&p_Var9[1]._M_left);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var25);
  }
  local_a8.content.ptr = " [<option>...]";
  if (local_38 == (_Base_ptr)0x0) {
    local_a8.content.ptr = "";
  }
  str<char_const(&)[8],kj::StringPtr&,char_const*>
            ((String *)local_e8,(kj *)"Usage: ",&local_70,&local_a8,params_2);
  pPVar22 = (ProcessContext *)
            ((char *)((long)&((ProcessContext *)(local_e8._0_8_ + -8))->_vptr_ProcessContext + 7) +
            local_e8._8_8_);
  pPVar6 = (ProcessContext *)local_e8._0_8_;
  if ((char **)local_e8._8_8_ == (char **)0x0) {
    pPVar22 = (ProcessContext *)0x0;
    pPVar6 = (ProcessContext *)0x0;
  }
  sVar24 = (long)pPVar22 - (long)pPVar6;
  puVar10 = (undefined1 *)(local_108._8_8_ + (sVar24 - local_108._0_8_));
  if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
    puVar16 = (undefined1 *)0x4;
    if (local_108._16_8_ != local_108._0_8_) {
      puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
    }
    if (puVar16 < puVar10) {
      puVar16 = puVar10;
    }
    Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
  }
  uVar7 = local_108._8_8_;
  if (pPVar6 != pPVar22) {
    memcpy((void *)local_108._8_8_,pPVar6,sVar24);
    local_108._8_8_ = uVar7 + sVar24;
  }
  ppcVar21 = (char **)local_e8._8_8_;
  uVar7 = local_e8._0_8_;
  if ((ProcessContext *)local_e8._0_8_ != (ProcessContext *)0x0) {
    local_e8._0_8_ = (ProcessContext *)0x0;
    local_e8._8_8_ = (char **)0x0;
    (**(code **)((Array<char> *)local_e8._16_8_)->ptr)(local_e8._16_8_,uVar7,1,ppcVar21,ppcVar21,0);
    params_2 = ppcVar21;
  }
  pIVar20 = *(Impl **)(local_e8._40_8_ + 8);
  if ((pIVar20->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pAVar3 = (pIVar20->args).builder.pos;
    for (this_00 = (pIVar20->args).builder.ptr; this_00 != pAVar3; this_00 = this_00 + 1) {
      if (local_108._8_8_ == local_108._16_8_) {
        sVar15 = (local_108._16_8_ - local_108._0_8_) * 2;
        if (local_108._16_8_ == local_108._0_8_) {
          sVar15 = 4;
        }
        Vector<char>::setCapacity((Vector<char> *)local_108,sVar15);
      }
      *(undefined1 *)&((Array<char> *)local_108._8_8_)->ptr = 0x20;
      local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 1;
      if (this_00->minCount == 0) {
        local_a8.content.ptr = "]";
        if (1 < this_00->maxCount) {
          local_a8.content.ptr = "...]";
        }
        str<char_const(&)[2],kj::StringPtr&,char_const*>
                  ((String *)local_e8,(kj *)"[",(char (*) [2])this_00,&local_a8,params_2);
        pPVar22 = (ProcessContext *)
                  ((char *)((long)&((ProcessContext *)(local_e8._0_8_ + -8))->_vptr_ProcessContext +
                           7) + local_e8._8_8_);
        pPVar6 = (ProcessContext *)local_e8._0_8_;
        if ((char **)local_e8._8_8_ == (char **)0x0) {
          pPVar22 = (ProcessContext *)0x0;
          pPVar6 = (ProcessContext *)0x0;
        }
        sVar24 = (long)pPVar22 - (long)pPVar6;
        puVar10 = (undefined1 *)(local_108._8_8_ + (sVar24 - local_108._0_8_));
        if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
          puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
          if (local_108._16_8_ == local_108._0_8_) {
            puVar16 = (undefined1 *)0x4;
          }
          if (puVar16 < puVar10) {
            puVar16 = puVar10;
          }
          Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
        }
        uVar7 = local_108._8_8_;
        if (pPVar6 != pPVar22) {
          memcpy((void *)local_108._8_8_,pPVar6,sVar24);
          local_108._8_8_ = uVar7 + sVar24;
        }
        ppcVar21 = (char **)local_e8._8_8_;
        uVar7 = local_e8._0_8_;
        if ((ProcessContext *)local_e8._0_8_ != (ProcessContext *)0x0) {
          local_e8._0_8_ = (ProcessContext *)0x0;
          local_e8._8_8_ = (char **)0x0;
          (**(code **)((Array<char> *)local_e8._16_8_)->ptr)
                    (local_e8._16_8_,uVar7,1,ppcVar21,ppcVar21,0);
          params_2 = ppcVar21;
        }
      }
      else {
        local_a8.content.ptr = "";
        if (1 < this_00->maxCount) {
          local_a8.content.ptr = "...";
        }
        str<kj::StringPtr&,char_const*>
                  ((String *)local_e8,(kj *)this_00,&local_a8,(char **)0x3088f8);
        pPVar22 = (ProcessContext *)
                  ((char *)((long)&((ProcessContext *)(local_e8._0_8_ + -8))->_vptr_ProcessContext +
                           7) + local_e8._8_8_);
        pPVar6 = (ProcessContext *)local_e8._0_8_;
        if ((char **)local_e8._8_8_ == (char **)0x0) {
          pPVar22 = (ProcessContext *)0x0;
          pPVar6 = (ProcessContext *)0x0;
        }
        sVar24 = (long)pPVar22 - (long)pPVar6;
        puVar10 = (undefined1 *)(local_108._8_8_ + (sVar24 - local_108._0_8_));
        if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
          puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
          if (local_108._16_8_ == local_108._0_8_) {
            puVar16 = (undefined1 *)0x4;
          }
          if (puVar16 < puVar10) {
            puVar16 = puVar10;
          }
          Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
        }
        uVar7 = local_108._8_8_;
        if (pPVar6 != pPVar22) {
          memcpy((void *)local_108._8_8_,pPVar6,sVar24);
          local_108._8_8_ = uVar7 + sVar24;
        }
        ppcVar21 = (char **)local_e8._8_8_;
        uVar7 = local_e8._0_8_;
        if ((ProcessContext *)local_e8._0_8_ != (ProcessContext *)0x0) {
          local_e8._0_8_ = (ProcessContext *)0x0;
          local_e8._8_8_ = (char **)0x0;
          (**(code **)((Array<char> *)local_e8._16_8_)->ptr)(local_e8._16_8_,uVar7,1);
          params_2 = ppcVar21;
        }
      }
    }
  }
  else {
    local_e8._0_8_ = " <command> [<arg>...]";
    local_e8._8_8_ = (char *)0x16;
    Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_108,(StringPtr *)local_e8);
  }
  local_e8._0_8_ = "\n\n";
  local_e8._8_8_ = (char *)0x3;
  Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_108,(StringPtr *)local_e8);
  pOVar14 = (ObjectHeader *)local_e8._40_8_;
  pSVar1 = &(*(Impl **)(local_e8._40_8_ + 8))->briefDescription;
  params_2_00 = (ChunkHeader *)(pSVar1->content).ptr;
  indent.content.size_ = 1;
  indent.content.ptr = "";
  wrapText(pMVar19,(Vector<char> *)local_108,indent,(StringPtr)pSVar1->content);
  if (((*(Impl **)((long)pOVar14 + 8))->subCommands)._M_t._M_impl.super__Rb_tree_header.
      _M_node_count != 0) goto LAB_0028f1b6;
  do {
    if (local_38 != (_Base_ptr)0x0) {
      local_e8._0_8_ = "\nOptions:\n";
      local_e8._8_8_ = (Impl *)0xb;
      pIVar20 = (Impl *)local_108;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_108,(StringPtr *)local_e8);
      pIVar23 = local_48;
      while (pIVar23 != (Impl *)&stack0xffffffffffffffa8) {
        local_e8._48_8_ = (pIVar23->briefDescription).content.size_;
        puVar10 = (undefined1 *)(local_108._8_8_ + (4 - local_108._0_8_));
        params_1 = (Impl *)local_108._0_8_;
        local_80 = pIVar23;
        if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
          puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
          params_1 = (Impl *)&DAT_00000004;
          if (local_108._16_8_ == local_108._0_8_) {
            puVar16 = (undefined1 *)0x4;
          }
          if (puVar16 < puVar10) {
            puVar16 = puVar10;
          }
          pIVar20 = (Impl *)local_108;
          Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
        }
        *(undefined4 *)&((Array<char> *)local_108._8_8_)->ptr = 0x20202020;
        local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 4;
        if (*(byte **)(local_e8._48_8_ + 8) != (byte *)0x0) {
          local_78 = (_Base_ptr)&((ChunkHeader *)(local_e8._48_8_ + 0x18))->pos;
          params = &(*(ChunkHeader **)local_e8._48_8_)->pos;
          lVar26 = (long)*(byte **)(local_e8._48_8_ + 8) << 4;
          local_e8._56_4_ = (int)CONCAT71((int7)((ulong)local_78 >> 8),1);
          do {
            if ((local_e8._56_8_ & 1) == 0) {
              puVar10 = (undefined1 *)(local_108._8_8_ + (2 - local_108._0_8_));
              params_1 = (Impl *)local_108._0_8_;
              if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
                puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
                params_1 = (Impl *)&DAT_00000004;
                if (local_108._16_8_ == local_108._0_8_) {
                  puVar16 = (undefined1 *)0x4;
                }
                if (puVar16 < puVar10) {
                  puVar16 = puVar10;
                }
                Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
              }
              *(undefined2 *)&((Array<char> *)local_108._8_8_)->ptr = 0x202c;
              local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 2;
            }
            else {
              local_e8._56_8_ = local_e8._56_8_ & 0xffffffff00000000;
            }
            if (*(char *)&((ChunkHeader *)(params + -1))->next == '\x01') {
              pIVar20 = (Impl *)local_e8;
              str<char_const(&)[3],char_const*const&>
                        ((String *)pIVar20,(kj *)"--",(char (*) [3])params,(char **)params_1);
              pPVar22 = (ProcessContext *)
                        ((char *)((long)&((ProcessContext *)(local_e8._0_8_ + -8))->
                                         _vptr_ProcessContext + 7) + local_e8._8_8_);
              pPVar6 = (ProcessContext *)local_e8._0_8_;
              if ((Impl *)local_e8._8_8_ == (Impl *)0x0) {
                pPVar22 = (ProcessContext *)0x0;
                pPVar6 = (ProcessContext *)0x0;
              }
              sVar24 = (long)pPVar22 - (long)pPVar6;
              puVar10 = (undefined1 *)(local_108._8_8_ + (sVar24 - local_108._0_8_));
              params_1 = (Impl *)local_108._0_8_;
              if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
                puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
                params_1 = (Impl *)&DAT_00000004;
                if (local_108._16_8_ == local_108._0_8_) {
                  puVar16 = (undefined1 *)0x4;
                }
                if (puVar16 < puVar10) {
                  puVar16 = puVar10;
                }
                pIVar20 = (Impl *)local_108;
                Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
              }
              uVar7 = local_108._8_8_;
              pIVar23 = (Impl *)local_108._8_8_;
              if (pPVar6 != pPVar22) {
                memcpy((void *)local_108._8_8_,pPVar6,sVar24);
                pIVar23 = (Impl *)(uVar7 + sVar24);
                pIVar20 = (Impl *)local_108._8_8_;
              }
              pIVar13 = (Impl *)local_e8._8_8_;
              uVar7 = local_e8._0_8_;
              local_108._8_8_ = pIVar23;
              if ((ProcessContext *)local_e8._0_8_ != (ProcessContext *)0x0) {
                local_e8._0_8_ = (ProcessContext *)0x0;
                local_e8._8_8_ = (Impl *)0x0;
                pIVar20 = (Impl *)local_e8._16_8_;
                (**(code **)((Array<char> *)local_e8._16_8_)->ptr)
                          (local_e8._16_8_,uVar7,1,pIVar13,pIVar13);
                params_1 = pIVar13;
              }
              if (*(char *)(local_e8._48_8_ + 0x10) == '\x01') {
                pIVar20 = (Impl *)local_e8;
                str<char_const(&)[2],kj::StringPtr_const&>
                          ((String *)pIVar20,(kj *)"=",(char (*) [2])local_78,(StringPtr *)params_1)
                ;
                pPVar22 = (ProcessContext *)
                          ((char *)((long)&((ProcessContext *)(local_e8._0_8_ + -8))->
                                           _vptr_ProcessContext + 7) + local_e8._8_8_);
                pPVar6 = (ProcessContext *)local_e8._0_8_;
                if ((Impl *)local_e8._8_8_ == (Impl *)0x0) {
                  pPVar22 = (ProcessContext *)0x0;
                  pPVar6 = (ProcessContext *)0x0;
                }
                sVar24 = (long)pPVar22 - (long)pPVar6;
                puVar10 = (undefined1 *)(local_108._8_8_ + (sVar24 - local_108._0_8_));
                params_1 = (Impl *)local_108._0_8_;
                if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
                  puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
                  params_1 = (Impl *)&DAT_00000004;
                  if (local_108._16_8_ == local_108._0_8_) {
                    puVar16 = (undefined1 *)0x4;
                  }
                  if (puVar16 < puVar10) {
                    puVar16 = puVar10;
                  }
                  pIVar20 = (Impl *)local_108;
                  Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
                }
                uVar7 = local_108._8_8_;
                pIVar23 = (Impl *)local_108._8_8_;
                if (pPVar6 != pPVar22) {
                  memcpy((void *)local_108._8_8_,pPVar6,sVar24);
                  pIVar23 = (Impl *)(uVar7 + sVar24);
                  pIVar20 = (Impl *)local_108._8_8_;
                }
                pIVar13 = (Impl *)local_e8._8_8_;
                uVar7 = local_e8._0_8_;
                local_108._8_8_ = pIVar23;
                if ((ProcessContext *)local_e8._0_8_ != (ProcessContext *)0x0) {
                  local_e8._0_8_ = (ProcessContext *)0x0;
                  local_e8._8_8_ = (Impl *)0x0;
                  pIVar20 = (Impl *)local_e8._16_8_;
                  (**(code **)((Array<char> *)local_e8._16_8_)->ptr)
                            (local_e8._16_8_,uVar7,1,pIVar13,pIVar13);
                  params_1 = pIVar13;
                }
              }
            }
            else {
              local_a8.content.ptr = "-";
              local_a8.content.size_ = 1;
              local_e8[0x27] = *(undefined1 *)params;
              pIVar20 = (Impl *)local_e8;
              kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                        ((String *)pIVar20,(_ *)&local_a8,(ArrayPtr<const_char> *)(local_e8 + 0x27),
                         (FixedArray<char,_1UL> *)params_1);
              pPVar22 = (ProcessContext *)
                        ((char *)((long)&((ProcessContext *)(local_e8._0_8_ + -8))->
                                         _vptr_ProcessContext + 7) + local_e8._8_8_);
              pPVar6 = (ProcessContext *)local_e8._0_8_;
              if ((Impl *)local_e8._8_8_ == (Impl *)0x0) {
                pPVar22 = (ProcessContext *)0x0;
                pPVar6 = (ProcessContext *)0x0;
              }
              sVar24 = (long)pPVar22 - (long)pPVar6;
              puVar10 = (undefined1 *)(local_108._8_8_ + (sVar24 - local_108._0_8_));
              params_1 = (Impl *)local_108._0_8_;
              if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar10) {
                puVar16 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
                params_1 = (Impl *)&DAT_00000004;
                if (local_108._16_8_ == local_108._0_8_) {
                  puVar16 = (undefined1 *)0x4;
                }
                if (puVar16 < puVar10) {
                  puVar16 = puVar10;
                }
                pIVar20 = (Impl *)local_108;
                Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar16);
              }
              uVar7 = local_108._8_8_;
              pIVar23 = (Impl *)local_108._8_8_;
              if (pPVar6 != pPVar22) {
                memcpy((void *)local_108._8_8_,pPVar6,sVar24);
                pIVar23 = (Impl *)(uVar7 + sVar24);
                pIVar20 = (Impl *)local_108._8_8_;
              }
              pIVar13 = (Impl *)local_e8._8_8_;
              uVar7 = local_e8._0_8_;
              local_108._8_8_ = pIVar23;
              if ((ProcessContext *)local_e8._0_8_ != (ProcessContext *)0x0) {
                local_e8._0_8_ = (ProcessContext *)0x0;
                local_e8._8_8_ = (Impl *)0x0;
                pIVar20 = (Impl *)local_e8._16_8_;
                (**(code **)((Array<char> *)local_e8._16_8_)->ptr)
                          (local_e8._16_8_,uVar7,1,pIVar13,pIVar13,0);
                params_1 = pIVar13;
              }
              if (*(char *)(local_e8._48_8_ + 0x10) == '\x01') {
                __src = ((ChunkHeader *)(local_e8._48_8_ + 0x18))->pos;
                pbVar4 = ((ChunkHeader *)(local_e8._48_8_ + 0x18))->end;
                pbVar11 = pbVar4 + (long)(local_108._8_8_ + (-1 - local_108._0_8_));
                params_1 = (Impl *)local_108._0_8_;
                if ((byte *)(local_108._16_8_ - local_108._0_8_) < pbVar11) {
                  newSize = (byte *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
                  params_1 = (Impl *)&DAT_00000004;
                  if (local_108._16_8_ == local_108._0_8_) {
                    newSize = &DAT_00000004;
                  }
                  if (newSize < pbVar11) {
                    newSize = pbVar11;
                  }
                  pIVar20 = (Impl *)local_108;
                  Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)newSize);
                }
                uVar7 = local_108._8_8_;
                if (__src != pbVar4 + (long)__src + -1) {
                  memcpy((void *)local_108._8_8_,__src,(size_t)(pbVar4 + -1));
                  pIVar20 = (Impl *)local_108._8_8_;
                  local_108._8_8_ =
                       (Impl *)((long)&((Array<char> *)uVar7)->ptr + (long)(pbVar4 + -1));
                }
              }
            }
            params = params + 2;
            lVar26 = lVar26 + -0x10;
          } while (lVar26 != 0);
        }
        if (local_108._8_8_ == local_108._16_8_) {
          sVar15 = (local_108._16_8_ - local_108._0_8_) * 2;
          if (local_108._16_8_ == local_108._0_8_) {
            sVar15 = 4;
          }
          pIVar20 = (Impl *)local_108;
          Vector<char>::setCapacity((Vector<char> *)local_108,sVar15);
        }
        *(undefined1 *)&((Array<char> *)local_108._8_8_)->ptr = 10;
        local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 1;
        pCVar2 = (ChunkHeader *)(local_e8._48_8_ + 0x30);
        params_2_00 = pCVar2->next;
        text_00.ptr = (char *)pCVar2->next;
        text_00.size_ = (size_t)pCVar2->pos;
        indent_01.content.size_ = 9;
        indent_01.content.ptr = "        ";
        wrapText((MainImpl *)pIVar20,(Vector<char> *)local_108,indent_01,(StringPtr)text_00);
        pIVar20 = local_80;
        pIVar23 = (Impl *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_80);
      }
      local_e8._0_8_ = "    --help\n        Display this help text and exit.\n";
      local_e8._8_8_ = (char *)0x35;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_108,(StringPtr *)local_e8);
      pOVar14 = (ObjectHeader *)local_e8._40_8_;
    }
    if ((((Impl *)pOVar14->next)->extendedDescription).content.size_ != 1) {
      local_e8[0] = 10;
      pMVar19 = (MainImpl *)local_108;
      Vector<char>::add<char>((Vector<char> *)local_108,local_e8);
      pSVar1 = &(*(Impl **)(local_e8._40_8_ + 8))->extendedDescription;
      params_2_00 = (ChunkHeader *)(pSVar1->content).ptr;
      indent_00.content.size_ = 1;
      indent_00.content.ptr = "";
      wrapText(pMVar19,(Vector<char> *)local_108,indent_00,(StringPtr)pSVar1->content);
    }
    local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00;
    Vector<char>::add<char>((Vector<char> *)local_108,local_e8);
    pPVar22 = (*(Impl **)(local_e8._40_8_ + 8))->context;
    Vector<char>::releaseAsArray(&local_98,(Vector<char> *)local_108);
    sVar15 = local_98.size_;
    pcVar8 = local_98.ptr;
    local_e8._0_8_ = local_98.ptr;
    local_e8._8_8_ = local_98.size_;
    local_e8._16_8_ = local_98.disposer;
    local_98.ptr = (char *)0x0;
    local_98.size_ = 0;
    p_Var17 = (_Base_ptr)0x308a6f;
    if ((_Base_ptr)sVar15 != (_Base_ptr)0x0) {
      p_Var17 = (_Base_ptr)pcVar8;
    }
    (*pPVar22->_vptr_ProcessContext[5])
              (pPVar22,p_Var17,
               (char *)((long)(_Rb_tree_color *)sVar15 +
                       (ulong)((_Base_ptr)sVar15 == (_Base_ptr)0x0)));
LAB_0028f1b6:
    local_e8._0_8_ = "\nCommands:\n";
    local_e8._8_8_ = (char *)0xc;
    Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_108,(StringPtr *)local_e8);
    p_Var9 = ((*(Impl **)(local_e8._40_8_ + 8))->subCommands)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    p_Var25 = &((*(Impl **)(local_e8._40_8_ + 8))->subCommands)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 == p_Var25) {
      puVar10 = (undefined1 *)0x0;
    }
    else {
      puVar10 = (undefined1 *)0x0;
      p_Var12 = p_Var9;
      do {
        puVar16 = (undefined1 *)((long)&p_Var12[1]._M_parent[-1]._M_right + 7);
        if (puVar16 < puVar10) {
          puVar16 = puVar10;
        }
        puVar10 = puVar16;
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var25);
    }
    if ((_Rb_tree_header *)p_Var9 != p_Var25) {
      local_e8._56_8_ = puVar10 + 1;
      do {
        puVar16 = (undefined1 *)(local_108._8_8_ + (2 - local_108._0_8_));
        if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar16) {
          puVar18 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
          if (local_108._16_8_ == local_108._0_8_) {
            puVar18 = (undefined1 *)0x4;
          }
          if (puVar18 < puVar16) {
            puVar18 = puVar16;
          }
          Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar18);
        }
        *(undefined2 *)&((Array<char> *)local_108._8_8_)->ptr = 0x2020;
        local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 2;
        pvVar5 = *(void **)(p_Var9 + 1);
        p_Var17 = p_Var9[1]._M_parent;
        puVar16 = (undefined1 *)((long)p_Var17 + (long)(local_108._8_8_ + (-1 - local_108._0_8_)));
        if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar16) {
          puVar18 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
          if (local_108._16_8_ == local_108._0_8_) {
            puVar18 = (undefined1 *)0x4;
          }
          if (puVar18 < puVar16) {
            puVar18 = puVar16;
          }
          Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar18);
        }
        uVar7 = local_108._8_8_;
        if ((undefined1 *)pvVar5 != (undefined1 *)((long)&p_Var17[-1]._M_right + 7) + (long)pvVar5)
        {
          puVar16 = (undefined1 *)((long)&p_Var17[-1]._M_right + 7);
          memcpy((void *)local_108._8_8_,pvVar5,(size_t)puVar16);
          local_108._8_8_ = (long)&((Array<char> *)uVar7)->ptr + (long)puVar16;
        }
        if ((undefined1 *)((long)&p_Var9[1]._M_parent[-1]._M_right + 7U) < puVar10) {
          lVar26 = local_e8._56_8_ - (long)p_Var9[1]._M_parent;
          do {
            if (local_108._8_8_ == local_108._16_8_) {
              sVar15 = (local_108._16_8_ - local_108._0_8_) * 2;
              if (local_108._16_8_ == local_108._0_8_) {
                sVar15 = 4;
              }
              Vector<char>::setCapacity((Vector<char> *)local_108,sVar15);
            }
            *(undefined1 *)&((Array<char> *)local_108._8_8_)->ptr = 0x20;
            local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 1;
            lVar26 = lVar26 + -1;
          } while (lVar26 != 0);
        }
        puVar16 = (undefined1 *)(local_108._8_8_ + (2 - local_108._0_8_));
        if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar16) {
          puVar18 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
          if (local_108._16_8_ == local_108._0_8_) {
            puVar18 = (undefined1 *)0x4;
          }
          if (puVar18 < puVar16) {
            puVar18 = puVar16;
          }
          Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar18);
        }
        *(undefined2 *)&((Array<char> *)local_108._8_8_)->ptr = 0x2020;
        local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 2;
        pvVar5 = *(void **)(p_Var9 + 2);
        p_Var17 = p_Var9[2]._M_parent;
        puVar16 = (undefined1 *)((long)p_Var17 + (long)(local_108._8_8_ + (-1 - local_108._0_8_)));
        if ((undefined1 *)(local_108._16_8_ - local_108._0_8_) < puVar16) {
          puVar18 = (undefined1 *)((long)(local_108._16_8_ - local_108._0_8_) * 2);
          if (local_108._16_8_ == local_108._0_8_) {
            puVar18 = (undefined1 *)0x4;
          }
          if (puVar18 < puVar16) {
            puVar18 = puVar16;
          }
          Vector<char>::setCapacity((Vector<char> *)local_108,(size_t)puVar18);
        }
        uVar7 = local_108._8_8_;
        if ((undefined1 *)pvVar5 != (undefined1 *)((long)&p_Var17[-1]._M_right + 7) + (long)pvVar5)
        {
          puVar16 = (undefined1 *)((long)&p_Var17[-1]._M_right + 7);
          memcpy((void *)local_108._8_8_,pvVar5,(size_t)puVar16);
          local_108._8_8_ = (long)&((Array<char> *)uVar7)->ptr + (long)puVar16;
        }
        if (local_108._8_8_ == local_108._16_8_) {
          sVar15 = (local_108._16_8_ - local_108._0_8_) * 2;
          if (local_108._16_8_ == local_108._0_8_) {
            sVar15 = 4;
          }
          Vector<char>::setCapacity((Vector<char> *)local_108,sVar15);
        }
        *(undefined1 *)&((Array<char> *)local_108._8_8_)->ptr = 10;
        local_108._8_8_ = (long)&((Array<char> *)local_108._8_8_)->ptr + 1;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var25);
    }
    str<char_const(&)[7],kj::StringPtr&,char_const(&)[62]>
              ((String *)local_e8,(kj *)"\nSee \'",(char (*) [7])local_70,
               (StringPtr *)" help <command>\' for more information on a specific command.\n",
               (char (*) [62])params_2_00);
    Vector<char>::addAll<kj::String>((Vector<char> *)local_108,(String *)local_e8);
    String::~String((String *)local_e8);
    pOVar14 = (ObjectHeader *)local_e8._40_8_;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::printHelp(StringPtr programName) {
  Vector<char> text(1024);

  std::set<const Impl::Option*, Impl::OptionDisplayOrder> sortedOptions;

  for (auto& entry: impl->shortOptions) {
    sortedOptions.insert(entry.second);
  }
  for (auto& entry: impl->longOptions) {
    sortedOptions.insert(entry.second);
  }

  text.addAll(str("Usage: ", programName, sortedOptions.empty() ? "" : " [<option>...]"));

  if (impl->subCommands.empty()) {
    for (auto& arg: impl->args) {
      text.add(' ');
      if (arg.minCount == 0) {
        text.addAll(str("[", arg.title, arg.maxCount > 1 ? "...]" : "]"));
      } else {
        text.addAll(str(arg.title, arg.maxCount > 1 ? "..." : ""));
      }
    }
  } else {
    text.addAll(" <command> [<arg>...]"_kj);
  }
  text.addAll("\n\n"_kj);

  wrapText(text, "", impl->briefDescription);

  if (!impl->subCommands.empty()) {
    text.addAll("\nCommands:\n"_kj);
    size_t maxLen = 0;
    for (auto& command: impl->subCommands) {
      maxLen = kj::max(maxLen, command.first.size());
    }
    for (auto& command: impl->subCommands) {
      text.addAll("  "_kj);
      text.addAll(command.first);
      for (size_t i = command.first.size(); i < maxLen; i++) {
        text.add(' ');
      }
      text.addAll("  "_kj);
      text.addAll(command.second.helpText);
      text.add('\n');
    }
    text.addAll(str(
        "\nSee '", programName, " help <command>' for more information on a specific command.\n"));
  }

  if (!sortedOptions.empty()) {
    text.addAll("\nOptions:\n"_kj);

    for (auto opt: sortedOptions) {
      text.addAll("    "_kj);
      bool isFirst = true;
      for (auto& name: opt->names) {
        if (isFirst) {
          isFirst = false;
        } else {
          text.addAll(", "_kj);
        }
        if (name.isLong) {
          text.addAll(str("--", name.longName));
          if (opt->hasArg) {
            text.addAll(str("=", opt->argTitle));
          }
        } else {
          text.addAll(str("-", name.shortName));
          if (opt->hasArg) {
            text.addAll(opt->argTitle);
          }
        }
      }
      text.add('\n');
      wrapText(text, "        ", opt->helpText);
    }

    text.addAll("    --help\n        Display this help text and exit.\n"_kj);
  }

  if (impl->extendedDescription.size() > 0) {
    text.add('\n');
    wrapText(text, "", impl->extendedDescription);
  }

  text.add('\0');
  impl->context.exitInfo(String(text.releaseAsArray()));
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}